

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write(uv_stream_t *stream)

{
  void *pvVar1;
  int iVar2;
  uv_write_t *req_00;
  iovec *vec;
  int *piVar3;
  bool bVar4;
  int *pi;
  void *pv;
  anon_union_64_2_d657c519 scratch;
  cmsghdr *cmsg;
  msghdr msg;
  int fd_to_send;
  int err;
  ssize_t n;
  int iovcnt;
  int iovmax;
  uv_write_t *req;
  QUEUE *q;
  iovec *iov;
  uv_stream_t *stream_local;
  
  while( true ) {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x32d,"void uv__write(uv_stream_t *)");
    }
    if (stream->write_queue == (void **)stream->write_queue[0]) {
      return;
    }
    pvVar1 = stream->write_queue[0];
    req_00 = (uv_write_t *)((long)pvVar1 + -0x58);
    if (*(uv_stream_t **)((long)pvVar1 + -8) != stream) {
      __assert_fail("req->handle == stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x334,"void uv__write(uv_stream_t *)");
    }
    vec = (iovec *)(*(long *)((long)pvVar1 + 0x18) + (ulong)*(uint *)((long)pvVar1 + 0x10) * 0x10);
    n._0_4_ = *(int *)((long)pvVar1 + 0x20) - *(int *)((long)pvVar1 + 0x10);
    iVar2 = uv__getiovmax();
    if (iVar2 < (int)n) {
      n._0_4_ = iVar2;
    }
    if (*(long *)((long)pvVar1 + -0x10) == 0) {
      do {
        _fd_to_send = uv__writev((stream->io_watcher).fd,vec,(long)(int)n);
        bVar4 = false;
        if (_fd_to_send == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
    }
    else {
      if ((*(uint *)(*(long *)((long)pvVar1 + -0x10) + 0x58) & 3) != 0) {
        msg._52_4_ = 0xfffffff7;
        goto LAB_007fd71c;
      }
      msg.msg_flags = uv__handle_fd(*(uv_handle_t **)((long)pvVar1 + -0x10));
      memset(&pv,0,0x40);
      if (msg.msg_flags < 0) {
        __assert_fail("fd_to_send >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x35b,"void uv__write(uv_stream_t *)");
      }
      cmsg = (cmsghdr *)0x0;
      msg.msg_name._0_4_ = 0;
      msg.msg_iov = (iovec *)(long)(int)n;
      msg.msg_controllen._0_4_ = 0;
      scratch._56_8_ = &pv;
      msg.msg_control = (void *)0x18;
      scratch.alias.cmsg_len._0_4_ = 1;
      scratch.alias.cmsg_len._4_4_ = 1;
      pv = (void *)0x14;
      scratch.alias.cmsg_level = msg.msg_flags;
      msg._8_8_ = vec;
      msg.msg_iovlen = scratch._56_8_;
      do {
        _fd_to_send = sendmsg((stream->io_watcher).fd,(msghdr *)&cmsg,0);
        bVar4 = false;
        if (_fd_to_send == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if (-1 < (long)_fd_to_send) {
        *(undefined8 *)((long)pvVar1 + -0x10) = 0;
      }
    }
    if ((((_fd_to_send == 0xffffffffffffffff) && (piVar3 = __errno_location(), *piVar3 != 0xb)) &&
        (piVar3 = __errno_location(), *piVar3 != 0xb)) &&
       (piVar3 = __errno_location(), *piVar3 != 0x69)) break;
    if ((-1 < (long)_fd_to_send) &&
       (iVar2 = uv__write_req_update(stream,req_00,_fd_to_send), iVar2 != 0)) {
      uv__write_req_finish(req_00);
      return;
    }
    if ((stream->flags & 0x100000) == 0) {
      uv__io_start(stream->loop,&stream->io_watcher,4);
      uv__stream_osx_interrupt_select(stream);
      return;
    }
  }
  piVar3 = __errno_location();
  msg._52_4_ = -*piVar3;
LAB_007fd71c:
  *(undefined4 *)((long)pvVar1 + 0x24) = msg._52_4_;
  uv__write_req_finish(req_00);
  uv__io_stop(stream->loop,&stream->io_watcher,4);
  iVar2 = uv__io_active(&stream->io_watcher,1);
  if (((iVar2 == 0) && ((stream->flags & 4) != 0)) &&
     (stream->flags = stream->flags & 0xfffffffb, (stream->flags & 8) != 0)) {
    stream->loop->active_handles = stream->loop->active_handles - 1;
  }
  uv__stream_osx_interrupt_select(stream);
  return;
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;
  int err;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(req->send_handle)) {
      err = UV_EBADF;
      goto error;
    }

    fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0)
      req->send_handle = NULL;
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n == -1 && !IS_TRANSIENT_WRITE_ERROR(errno, req->send_handle)) {
    err = UV__ERR(errno);
    goto error;
  }

  if (n >= 0 && uv__write_req_update(stream, req, n)) {
    uv__write_req_finish(req);
    return;  /* TODO(bnoordhuis) Start trying to write the next request. */
  }

  /* If this is a blocking stream, try again. */
  if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
    goto start;

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);

  return;

error:
  req->error = err;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  if (!uv__io_active(&stream->io_watcher, POLLIN))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
}